

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::LevelSpawned(AActor *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  
  if ((0 < this->tics) && (((this->flags4).Value & 0x200000) == 0)) {
    uVar2 = FRandom::GenRand32(&pr_spawnmapthing);
    this->tics = (int)((long)(ulong)(uVar2 & 0xff) % (long)this->tics) + 1;
  }
  pPVar4 = (this->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
    (this->super_DThinker).super_DObject.Class = pPVar4;
  }
  if ((pPVar4->Defaults[0x1be] & 2) == 0) {
    pbVar1 = (byte *)((long)&(this->flags).Value + 2);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[0xb])(this);
  return;
}

Assistant:

void AActor::LevelSpawned ()
{
	if (tics > 0 && !(flags4 & MF4_SYNCHRONIZED))
	{
		tics = 1 + (pr_spawnmapthing() % tics);
	}
	// [RH] Clear MF_DROPPED flag if the default version doesn't have it set.
	// (AInventory::BeginPlay() makes all inventory items spawn with it set.)
	if (!(GetDefault()->flags & MF_DROPPED))
	{
		flags &= ~MF_DROPPED;
	}
	HandleSpawnFlags ();
}